

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::CaseContext::CaseContext
          (CaseContext *this,string *name_,TestContext *testContext_,FloatFormat *floatFormat_,
          FloatFormat *highpFormat_,Precision precision_,ShaderType shaderType_,size_t numRandoms_)

{
  Precision precision__local;
  FloatFormat *highpFormat__local;
  FloatFormat *floatFormat__local;
  TestContext *testContext__local;
  string *name__local;
  CaseContext *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name_);
  this->testContext = testContext_;
  memcpy(&this->floatFormat,floatFormat_,0x28);
  memcpy(&this->highpFormat,highpFormat_,0x28);
  this->precision = precision_;
  this->shaderType = shaderType_;
  this->numRandoms = numRandoms_;
  return;
}

Assistant:

CaseContext		(const string&		name_,
									 TestContext&		testContext_,
									 const FloatFormat&	floatFormat_,
									 const FloatFormat&	highpFormat_,
									 Precision			precision_,
									 ShaderType			shaderType_,
									 size_t				numRandoms_)
						: name				(name_)
						, testContext		(testContext_)
						, floatFormat		(floatFormat_)
						, highpFormat		(highpFormat_)
						, precision			(precision_)
						, shaderType		(shaderType_)
						, numRandoms		(numRandoms_) {}